

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# depspawn.cpp
# Opt level: O3

bool depspawn::internal::is_contained(Workitem *w,Workitem *ancestor)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  arg_info *this;
  arg_info *other;
  
  this = w->args;
  other = ancestor->args;
  if (this != (arg_info *)0x0 && other != (arg_info *)0x0) {
    do {
      uVar1 = this->addr;
      uVar2 = other->addr;
      if (uVar1 < uVar2) {
        return false;
      }
      if (this->rank == '\0') {
        if (uVar2 + other->size < uVar1 + this->size) goto LAB_0010aac2;
LAB_0010aac8:
        this = this->next;
      }
      else {
        if (uVar2 == uVar1) {
          bVar3 = arg_info::is_contained_array(this,other);
          if (!bVar3) {
            return false;
          }
          goto LAB_0010aac8;
        }
LAB_0010aac2:
        other = other->next;
      }
    } while ((other != (arg_info *)0x0) && (this != (arg_info *)0x0));
  }
  return this == (arg_info *)0x0;
}

Assistant:

bool is_contained(const Workitem* const w, const Workitem * const ancestor)
    {
      const arg_info *arg_w = w->args;
      const arg_info *arg_p = ancestor->args;
      
      while(arg_p && arg_w) {
        
        if (arg_w->addr < arg_p->addr) {
          return false;
        }
        
        if (arg_w->is_array()) {
          if(arg_p->addr == arg_w->addr) {
            if(!arg_w->is_contained_array(arg_p))
              return false;
            //Same array. Was contained => progress w
            arg_w = arg_w->next;
          } else { // Different array, arg_w->addr > arg_p->addr => progress p
            arg_p = arg_p->next;
          }
        } else { //Here arg_p->addr <= arg_w->addr
          if ((arg_w->addr + arg_w->size) <= (arg_p->addr + arg_p->size) ) {
            arg_w = arg_w->next;
          } else {
            arg_p = arg_p->next;
          }
        }
        
      }
      
      return arg_w == nullptr;
    }